

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::
         write_significand<char,fmt::v8::appender,unsigned_int,fmt::v8::detail::digit_grouping<char>>
                   (appender out,uint significand,int significand_size,int exponent,
                   digit_grouping<char> *grouping)

{
  size_t *psVar1;
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar2;
  appender out_00;
  format_decimal_result<char_*> fVar3;
  undefined **local_250;
  memory_buffer buffer;
  char buffer_2 [10];
  
  if ((grouping->sep_).thousands_sep == '\0') {
    fVar3 = format_decimal<char,unsigned_int>((char *)&local_250,significand,significand_size);
    out_00 = copy_str_noinline<char,char*,fmt::v8::appender>((char *)&local_250,fVar3.end,out);
    local_250 = (undefined **)CONCAT71(local_250._1_7_,0x30);
    bVar2.container =
         (buffer<char> *)fill_n<fmt::v8::appender,int,char>(out_00,exponent,(char *)&local_250);
  }
  else {
    psVar1 = &buffer.super_buffer<char>.capacity_;
    buffer.super_buffer<char>.ptr_ = (char *)0x0;
    local_250 = &PTR_grow_001c5330;
    buffer.super_buffer<char>.size_ = 500;
    buffer.super_buffer<char>._vptr_buffer = (_func_int **)psVar1;
    fVar3 = format_decimal<char,unsigned_int>(&buffer.field_0x216,significand,significand_size);
    copy_str_noinline<char,char*,fmt::v8::appender>
              (&buffer.field_0x216,fVar3.end,(appender)&local_250);
    buffer._534_1_ = 0x30;
    fill_n<fmt::v8::appender,int,char>((appender)&local_250,exponent,&buffer.field_0x216);
    digits.size_ = (size_t)buffer.super_buffer<char>.ptr_;
    digits.data_ = (char *)buffer.super_buffer<char>._vptr_buffer;
    bVar2.container =
         (buffer<char> *)digit_grouping<char>::apply<fmt::v8::appender,char>(grouping,out,digits);
    if (buffer.super_buffer<char>._vptr_buffer != (_func_int **)psVar1) {
      operator_delete(buffer.super_buffer<char>._vptr_buffer);
    }
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}